

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateStartVectorField
          (KotlinGenerator *this,FieldDef *field,CodeWriter *writer,IDLOptions *options)

{
  char *__s;
  size_t sVar1;
  anon_class_8_1_72ac95b1 local_1d8;
  function<void_()> local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  string local_110;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  char *local_50;
  char *params;
  Type vector_type;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  FieldDef *field_local;
  KotlinGenerator *this_local;
  
  vector_type._24_8_ = options;
  Type::VectorType((Type *)&params,&(field->value).type);
  local_50 = "builder: FlatBufferBuilder, numElems: Int";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"size",&local_71);
  sVar1 = InlineSize((Type *)&params);
  NumToString<unsigned_long>(&local_a8,sVar1);
  CodeWriter::SetValue(writer,&local_70,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"align",&local_c9);
  sVar1 = InlineAlignment((Type *)&params);
  NumToString<unsigned_long>(&local_f0,sVar1);
  CodeWriter::SetValue(writer,&local_c8,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"start",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Vector",&local_159);
  IdlNamer::Method(&local_110,&this->namer_,&local_130,field,&local_158);
  __s = local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,__s,&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"",&local_1a9);
  local_1d8.writer = writer;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinGenerator::GenerateStartVectorField(flatbuffers::FieldDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_1d0,&local_1d8);
  GenerateFunOneLine(writer,&local_110,&local_180,&local_1a8,&local_1d0,
                     (bool)(options->gen_jvmstatic & 1));
  std::function<void_()>::~function(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  return;
}

Assistant:

void GenerateStartVectorField(FieldDef &field, CodeWriter &writer,
                                const IDLOptions options) const {
    // Generate a method to start a vector, data to be added manually
    // after.
    auto vector_type = field.value.type.VectorType();
    auto params = "builder: FlatBufferBuilder, numElems: Int";
    writer.SetValue("size", NumToString(InlineSize(vector_type)));
    writer.SetValue("align", NumToString(InlineAlignment(vector_type)));

    GenerateFunOneLine(
        writer, namer_.Method("start", field, "Vector"), params, "",
        [&]() {
          writer += "builder.startVector({{size}}, numElems, {{align}})";
        },
        options.gen_jvmstatic);
  }